

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O0

void dictionary_close(dictionary_t t_dictionary)

{
  dictionary_desc *dictionary;
  dictionary_t t_dictionary_local;
  
  if (*t_dictionary == 0) {
    dictionary_text_close(*(dictionary_t *)((long)t_dictionary + 8));
  }
  else {
    if (*t_dictionary != 1) {
      fprintf(_stderr,"Should not be here %s: %d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/dictionary/abstract.c"
              ,0x43);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/dictionary/abstract.c"
                    ,0x43,"void dictionary_close(dictionary_t)");
    }
    dictionary_datrie_close(*(dictionary_t *)((long)t_dictionary + 8));
  }
  free(t_dictionary);
  return;
}

Assistant:

void dictionary_close(dictionary_t t_dictionary)
{
	dictionary_desc * dictionary = (dictionary_desc *) t_dictionary;
	switch (dictionary->type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		dictionary_text_close(dictionary->dict);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		dictionary_datrie_close(dictionary->dict);
		break;
	default:
		debug_should_not_be_here();
	}
	free(dictionary);
}